

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfilters.h
# Opt level: O1

void __thiscall embree::LineCommentFilter::~LineCommentFilter(LineCommentFilter *this)

{
  pointer pcVar1;
  Stream<int> *pSVar2;
  
  (this->super_Stream<int>).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__LineCommentFilter_002d0d68;
  pcVar1 = (this->lineComment)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->lineComment).field_2) {
    operator_delete(pcVar1);
  }
  pSVar2 = (this->cin).ptr;
  if (pSVar2 != (Stream<int> *)0x0) {
    (*(pSVar2->super_RefCount)._vptr_RefCount[3])();
  }
  (this->super_Stream<int>).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Stream_002d0dd8;
  std::
  vector<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
  ::~vector(&(this->super_Stream<int>).buffer);
  operator_delete(this);
  return;
}

Assistant:

LineCommentFilter (const FileName& fileName, const std::string& lineComment)
      : cin(new FileStream(fileName)), lineComment(lineComment) {}